

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O0

S2Point * S2::GetCentroid(S2Point *__return_storage_ptr__,S2Shape *shape)

{
  size_type in_RCX;
  S2PointSpan polyline;
  S2PointSpan local_c8;
  S2Point local_b8;
  S2 *local_a0;
  pointer local_98;
  S2Point local_90;
  D local_78 [2];
  int local_44;
  int local_40;
  int chain_id;
  int num_chains;
  int local_2c;
  undefined1 local_28 [4];
  int dimension;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Shape *shape_local;
  
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)shape;
  Vector3<double>::Vector3(__return_storage_ptr__);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_28);
  local_2c = (**(code **)((long)(vertices.
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->c_[0] + 0x20))
                       ();
  local_40 = (**(code **)((long)(vertices.
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->c_[0] + 0x30))
                       ();
  for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
    if (local_2c == 0) {
      (**(code **)((long)(vertices.
                          super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->c_[0] + 0x18))
                (local_78,vertices.
                          super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_44);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,local_78);
    }
    else if (local_2c == 1) {
      GetChainVertices((S2Shape *)
                       vertices.
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,local_44,
                       (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_28);
      absl::Span<Vector3<double>const>::
      Span<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,void,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                ((Span<Vector3<double>const> *)&local_a0,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_28);
      polyline.len_ = in_RCX;
      polyline.ptr_ = local_98;
      GetCentroid(&local_90,local_a0,polyline);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_90);
    }
    else {
      GetChainVertices((S2Shape *)
                       vertices.
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,local_44,
                       (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_28);
      S2PointLoopSpan::
      Span<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,void,std::vector>
                ((S2PointLoopSpan *)&local_c8,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_28);
      GetCentroid(&local_b8,(S2PointLoopSpan)local_c8);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_b8);
    }
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCentroid(const S2Shape& shape) {
  S2Point centroid;
  vector<S2Point> vertices;
  int dimension = shape.dimension();
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    switch (dimension) {
      case 0:
        centroid += shape.edge(chain_id).v0;
        break;
      case 1:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointSpan(vertices));
        break;
      default:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointLoopSpan(vertices));
        break;
    }
  }
  return centroid;
}